

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O3

int Bbl_ManSopCheckUnique(Bbl_Man_t *p,char *pSop,int nVars,int nCubes,int iFunc)

{
  int iVar1;
  int iVar2;
  Vec_Str_t *p_00;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  int *piVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  sVar8 = strlen(pSop);
  uVar10 = (int)sVar8 + 1;
  uVar5 = (int)sVar8 + 4;
  if (-1 < (int)uVar10) {
    uVar5 = uVar10;
  }
  iVar13 = 0x10;
  if (nVars < 0x10) {
    iVar13 = nVars;
  }
  iVar12 = 0x10;
  if (nCubes < 0x10) {
    iVar12 = nCubes;
  }
  iVar1 = p->SopMap[iVar13][iVar12];
  p_00 = p->pEnts;
  if (iVar1 != 0) {
    iVar11 = (uint)(0 < (int)(uVar10 & 0x80000003)) + ((int)uVar5 >> 2);
    pcVar3 = p_00->pArray;
    pcVar4 = p->pFncs->pArray;
    iVar6 = iVar1;
    do {
      iVar2 = *(int *)(pcVar3 + iVar6);
      iVar7 = *(int *)(pcVar4 + iVar2);
      if (iVar7 != iVar11 && (nCubes < 0x10 && nVars < 0x10)) {
        __assert_fail("nVars == 16 || nCubes == 16 || pFnc->nWords == nWords",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/bbl/bblif.c"
                      ,0x3a7,"int Bbl_ManSopCheckUnique(Bbl_Man_t *, char *, int, int, int)");
      }
      if ((iVar7 == iVar11) &&
         (iVar7 = bcmp(pcVar4 + (long)iVar2 + 4,pSop,(long)(int)uVar10), iVar7 == 0)) {
        return iVar2;
      }
      iVar6 = *(int *)(pcVar3 + (long)iVar6 + 4);
    } while (iVar6 != 0);
  }
  piVar9 = (int *)Vec_StrFetch(p_00,8);
  *piVar9 = iFunc;
  piVar9[1] = iVar1;
  p->SopMap[iVar13][iVar12] = (int)piVar9 - *(int *)&p->pEnts->pArray;
  return iFunc;
}

Assistant:

int Bbl_ManSopCheckUnique( Bbl_Man_t * p, char * pSop, int nVars, int nCubes, int iFunc )
{
    Bbl_Fnc_t * pFnc;
    Bbl_Ent_t * pEnt;
    int h, Length = strlen(pSop) + 1;
    int nWords = (Length / 4 + (Length % 4 > 0));
    if ( nVars > 16 )   nVars = 16;
    if ( nCubes > 16 )  nCubes = 16;
//    if ( nVars == 16 && nCubes == 16 )
//        return iFunc;
    for ( h = p->SopMap[nVars][nCubes]; h; h = pEnt->iNext )
    {
        pEnt = Bbl_VecEnt( p->pEnts, h );
        pFnc = Bbl_VecFnc( p->pFncs, pEnt->iFunc );
        assert( nVars == 16 || nCubes == 16 || pFnc->nWords == nWords );
        if ( pFnc->nWords == nWords && memcmp( pFnc->pWords, pSop, Length ) == 0 )
            return pEnt->iFunc;
    }
    p->SopMap[nVars][nCubes] = Bbl_ManCreateEntry( p, iFunc, p->SopMap[nVars][nCubes] );
    return iFunc;
}